

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  uint composite;
  uint *puVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  uint uVar4;
  Id IVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer puVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  Id typeId;
  ulong uVar14;
  uint col;
  uint row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  uint local_98;
  uint local_94;
  uint local_90;
  Id local_8c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  Decoration local_3c;
  Id local_38;
  Id local_34;
  
  uVar4 = getNumTypeConstituents(this,resultTypeId);
  puVar1 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = sources;
  if ((long)(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 4) {
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar2[*puVar1] == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)ppIVar2[*puVar1]->typeId;
    }
    if ((ppIVar2[uVar11]->opCode - OpTypeBool < 3) &&
       ((1 < uVar4 || (ppIVar2[resultTypeId]->opCode == OpTypeCooperativeVectorNV)))) {
      IVar5 = smearScalar(this,precision,*puVar1,resultTypeId);
      return IVar5;
    }
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar3 = ppIVar2[*puVar1];
    if (pIVar3 == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)pIVar3->typeId;
    }
    if (ppIVar2[uVar11]->opCode == OpTypeVector) {
      if (pIVar3 == (Instruction *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = pIVar3->typeId;
      }
      uVar6 = getNumTypeConstituents(this,IVar5);
      if (uVar4 == uVar6) {
        uVar4 = *(local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pIVar3 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar4];
        if (pIVar3 == (Instruction *)0x0) {
          IVar5 = 0;
        }
        else {
          IVar5 = pIVar3->typeId;
        }
        if (IVar5 == resultTypeId) {
          return uVar4;
        }
        __assert_fail("resultTypeId == getTypeId(sources[0])",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xde3,
                      "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)")
        ;
      }
    }
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_3c = precision;
  local_34 = resultTypeId;
  local_38 = getScalarTypeId(this,resultTypeId);
  puVar9 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar9) {
    local_48 = 0;
  }
  else {
    uVar11 = 0;
    uVar6 = 0;
    local_48 = 0;
    pvVar13 = local_50;
    do {
      composite = puVar9[uVar11];
      uVar14 = (ulong)composite;
      ppIVar2 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar3 = ppIVar2[uVar14];
      if (pIVar3 == (Instruction *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)pIVar3->typeId;
      }
      if (ppIVar2[uVar12]->opCode - OpTypeBool < 3) {
LAB_00467416:
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_88.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,composite);
        if (1 < uVar4) {
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_88);
            pvVar13 = local_50;
            uVar14 = local_48;
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = composite;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            uVar14 = local_48;
          }
        }
        local_48 = uVar14;
        uVar6 = uVar6 + 1;
      }
      else {
        if (pIVar3 == (Instruction *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = pIVar3->typeId;
        }
        if (ppIVar2[uVar10]->opCode == OpTypePointer) goto LAB_00467416;
        if (pIVar3 == (Instruction *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)pIVar3->typeId;
        }
        if (ppIVar2[uVar12]->opCode == OpTypeVector) {
LAB_004674b7:
          if (pIVar3 == (Instruction *)0x0) {
            IVar5 = 0;
          }
          else {
            IVar5 = pIVar3->typeId;
          }
          uVar7 = getNumTypeConstituents(this,IVar5);
          uVar10 = uVar4 - uVar6;
          if (uVar7 + uVar6 <= uVar4) {
            uVar10 = uVar7;
          }
          local_98 = 0;
          pvVar13 = local_50;
          if (uVar10 != 0) {
            do {
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (uint *)0x0;
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                         (iterator)0x0,&local_98);
              local_8c = createRvalueSwizzle(this,local_3c,local_38,composite,&local_88);
              uVar14 = CONCAT44(extraout_var,local_8c);
              if (1 < uVar4) {
                if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                             (iterator)
                             local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_8c);
                  uVar14 = local_48;
                }
                else {
                  *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_8c;
                  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                  uVar14 = local_48;
                }
              }
              local_48 = uVar14;
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              local_98 = local_98 + 1;
              uVar6 = uVar6 + 1;
              pvVar13 = local_50;
            } while (local_98 < uVar10);
          }
        }
        else {
          if (pIVar3 == (Instruction *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)pIVar3->typeId;
          }
          if (ppIVar2[uVar12]->opCode == OpTypeCooperativeVectorNV) goto LAB_004674b7;
          if (pIVar3 == (Instruction *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)pIVar3->typeId;
          }
          if (ppIVar2[uVar12]->opCode != OpTypeMatrix) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                          ,0xe23,
                          "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)"
                         );
          }
          typeId = 0;
          IVar5 = 0;
          if (pIVar3 != (Instruction *)0x0) {
            IVar5 = pIVar3->typeId;
          }
          local_90 = getTypeNumColumns(this,IVar5);
          pIVar3 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14];
          if (pIVar3 != (Instruction *)0x0) {
            typeId = pIVar3->typeId;
          }
          uVar8 = getTypeNumRows(this,typeId);
          uVar10 = uVar8 * local_90 + uVar6;
          uVar7 = uVar4 - uVar6;
          if (uVar10 <= uVar4) {
            uVar7 = uVar8 * local_90;
          }
          local_98 = 0;
          local_94 = 0;
          pvVar13 = local_50;
          if (uVar7 != 0) {
            uVar6 = 0;
            local_90 = uVar10;
            do {
              uVar10 = local_94;
              pIVar3 = (this->module).idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar14];
              IVar5 = 0;
              if (pIVar3 != (Instruction *)0x0) {
                IVar5 = pIVar3->typeId;
              }
              uVar8 = getTypeNumRows(this,IVar5);
              if (uVar8 <= uVar10) {
                local_94 = 0;
                local_98 = local_98 + 1;
              }
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (uint *)0x0;
              local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                         (iterator)0x0,&local_98);
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                           (iterator)
                           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_94);
              }
              else {
                *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_94;
                local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              local_8c = createCompositeExtract(this,composite,local_38,&local_88);
              uVar12 = CONCAT44(extraout_var_00,local_8c);
              if (1 < uVar4) {
                if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish ==
                    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                             (iterator)
                             local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_8c);
                  uVar12 = local_48;
                }
                else {
                  *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_8c;
                  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                  uVar12 = local_48;
                }
              }
              local_48 = uVar12;
              local_94 = local_94 + 1;
              if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_88.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_88.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_88.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar7);
            pvVar13 = local_50;
            uVar6 = local_90;
            if (uVar4 < local_90) {
              uVar6 = uVar4;
            }
          }
        }
      }
      if (uVar4 <= uVar6) break;
      uVar11 = (ulong)((int)uVar11 + 1);
      puVar9 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(pvVar13->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2))
    ;
  }
  IVar5 = (Id)local_48;
  if ((local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (IVar5 = createCompositeConstruct(this,local_34,&local_68),
     IVar5 != 0 && local_3c != DecorationMax)) {
    addDecoration(this,IVar5,local_3c,-1);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar5;
}

Assistant:

Id Builder::createConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id result = NoResult;
    unsigned int numTargetComponents = getNumTypeComponents(resultTypeId);
    unsigned int targetComponent = 0;

    // Special case: when calling a vector constructor with a single scalar
    // argument, smear the scalar
    if (sources.size() == 1 && isScalar(sources[0]) && (numTargetComponents > 1 || isCooperativeVectorType(resultTypeId)))
        return smearScalar(precision, sources[0], resultTypeId);

    // Special case: 2 vectors of equal size
    if (sources.size() == 1 && isVector(sources[0]) && numTargetComponents == getNumComponents(sources[0])) {
        assert(resultTypeId == getTypeId(sources[0]));
        return sources[0];
    }

    // accumulate the arguments for OpCompositeConstruct
    std::vector<Id> constituents;
    Id scalarTypeId = getScalarTypeId(resultTypeId);

    // lambda to store the result of visiting an argument component
    const auto latchResult = [&](Id comp) {
        if (numTargetComponents > 1)
            constituents.push_back(comp);
        else
            result = comp;
        ++targetComponent;
    };

    // lambda to visit a vector argument's components
    const auto accumulateVectorConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumComponents(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            std::vector<unsigned> swiz;
            swiz.push_back(s);
            latchResult(createRvalueSwizzle(precision, scalarTypeId, sourceArg, swiz));
        }
    };

    // lambda to visit a matrix argument's components
    const auto accumulateMatrixConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumColumns(sourceArg) * getNumRows(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        unsigned int col = 0;
        unsigned int row = 0;
        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            if (row >= getNumRows(sourceArg)) {
                row = 0;
                col++;
            }
            std::vector<Id> indexes;
            indexes.push_back(col);
            indexes.push_back(row);
            latchResult(createCompositeExtract(sourceArg, scalarTypeId, indexes));
            row++;
        }
    };

    // Go through the source arguments, each one could have either
    // a single or multiple components to contribute.
    for (unsigned int i = 0; i < sources.size(); ++i) {

        if (isScalar(sources[i]) || isPointer(sources[i]))
            latchResult(sources[i]);
        else if (isVector(sources[i]) || isCooperativeVector(sources[i]))
            accumulateVectorConstituents(sources[i]);
        else if (isMatrix(sources[i]))
            accumulateMatrixConstituents(sources[i]);
        else
            assert(0);

        if (targetComponent >= numTargetComponents)
            break;
    }

    // If the result is a vector, make it from the gathered constituents.
    if (constituents.size() > 0) {
        result = createCompositeConstruct(resultTypeId, constituents);
        return setPrecision(result, precision);
    } else {
      // Precision was set when generating this component.
      return result;
    }
}